

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

void __thiscall cmExportCommand::cmExportCommand(cmExportCommand *this)

{
  cmExportCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmExportCommand_00a3f4a8;
  cmCommandArgumentGroup::cmCommandArgumentGroup(&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Targets,&(this->super_cmCommand).Helper,"TARGETS",(cmCommandArgumentGroup *)0x0)
  ;
  cmCAEnabler::cmCAEnabler
            (&this->Append,&(this->super_cmCommand).Helper,"APPEND",&this->ArgumentGroup);
  cmCAString::cmCAString
            (&this->ExportSetName,&(this->super_cmCommand).Helper,"EXPORT",&this->ArgumentGroup);
  cmCAString::cmCAString
            (&this->Namespace,&(this->super_cmCommand).Helper,"NAMESPACE",&this->ArgumentGroup);
  cmCAString::cmCAString
            (&this->Filename,&(this->super_cmCommand).Helper,"FILE",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler
            (&this->ExportOld,&(this->super_cmCommand).Helper,"EXPORT_LINK_INTERFACE_LIBRARIES",
             &this->ArgumentGroup);
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  this->ExportSet = (cmExportSet *)0x0;
  return;
}

Assistant:

cmExportCommand::cmExportCommand()
:cmCommand()
,ArgumentGroup()
,Targets(&Helper, "TARGETS")
,Append(&Helper, "APPEND", &ArgumentGroup)
,ExportSetName(&Helper, "EXPORT", &ArgumentGroup)
,Namespace(&Helper, "NAMESPACE", &ArgumentGroup)
,Filename(&Helper, "FILE", &ArgumentGroup)
,ExportOld(&Helper, "EXPORT_LINK_INTERFACE_LIBRARIES", &ArgumentGroup)
{
  this->ExportSet = 0;
}